

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall spv::Builder::If::If(If *this,Id cond,uint ctrl,Builder *gb)

{
  Function *pFVar1;
  Builder *pBVar2;
  Block *pBVar3;
  pointer *__ptr;
  Id IVar4;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  this->builder = gb;
  this->condition = cond;
  this->control = ctrl;
  this->elseBlock = (Block *)0x0;
  pFVar1 = gb->buildPoint->parent;
  this->function = pFVar1;
  pBVar3 = (Block *)operator_new(0x90);
  IVar4 = gb->uniqueId + 1;
  gb->uniqueId = IVar4;
  pBVar3->_vptr_Block = (_func_int **)&PTR__Block_00b0da78;
  (pBVar3->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar3->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar3->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar3->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar3->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar3->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar3->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar3->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar3->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar3->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar3->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar3->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar3->parent = pFVar1;
  (pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<spv::DebugSourceLocation>._M_engaged = false;
  (pBVar3->currentDebugScope).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  pBVar3->unreachable = false;
  local_38._M_head_impl = (Instruction *)operator_new(0x60);
  (local_38._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
  (local_38._M_head_impl)->resultId = IVar4;
  (local_38._M_head_impl)->typeId = 0;
  (local_38._M_head_impl)->opCode = OpLabel;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  ((local_38._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_38._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_38._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (local_38._M_head_impl)->block = (Block *)0x0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar3->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  ((pBVar3->instructions).
   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar3;
  Module::mapInstruction
            (pFVar1->parent,
             (pBVar3->instructions).
             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  this->thenBlock = pBVar3;
  pBVar3 = (Block *)operator_new(0x90);
  IVar4 = this->builder->uniqueId + 1;
  this->builder->uniqueId = IVar4;
  pFVar1 = this->function;
  pBVar3->_vptr_Block = (_func_int **)&PTR__Block_00b0da78;
  (pBVar3->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar3->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar3->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar3->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar3->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar3->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar3->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar3->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar3->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar3->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar3->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar3->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pBVar3->parent = pFVar1;
  (pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<spv::DebugSourceLocation>._M_engaged = false;
  (pBVar3->currentDebugScope).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  pBVar3->unreachable = false;
  local_38._M_head_impl = (Instruction *)operator_new(0x60);
  (local_38._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
  (local_38._M_head_impl)->resultId = IVar4;
  (local_38._M_head_impl)->typeId = 0;
  (local_38._M_head_impl)->opCode = OpLabel;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  ((local_38._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_38._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_38._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  ((local_38._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (local_38._M_head_impl)->block = (Block *)0x0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar3->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  ((pBVar3->instructions).
   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar3;
  Module::mapInstruction
            (pFVar1->parent,
             (pBVar3->instructions).
             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  this->mergeBlock = pBVar3;
  this->headerBlock = this->builder->buildPoint;
  createSelectionMerge(this->builder,pBVar3,this->control);
  spv::Function::addBlock(this->function,this->thenBlock);
  pBVar2 = this->builder;
  pBVar2->buildPoint = this->thenBlock;
  pBVar2->dirtyLineTracker = true;
  pBVar2->dirtyScopeTracker = true;
  return;
}

Assistant:

Builder::If::If(Id cond, unsigned int ctrl, Builder& gb) :
    builder(gb),
    condition(cond),
    control(ctrl),
    elseBlock(nullptr)
{
    function = &builder.getBuildPoint()->getParent();

    // make the blocks, but only put the then-block into the function,
    // the else-block and merge-block will be added later, in order, after
    // earlier code is emitted
    thenBlock = new Block(builder.getUniqueId(), *function);
    mergeBlock = new Block(builder.getUniqueId(), *function);

    // Save the current block, so that we can add in the flow control split when
    // makeEndIf is called.
    headerBlock = builder.getBuildPoint();
    builder.createSelectionMerge(mergeBlock, control);

    function->addBlock(thenBlock);
    builder.setBuildPoint(thenBlock);
}